

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive_set_column.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::
Intrusive_set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)8,true,true,true>>>
::
Intrusive_set_column<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
          (Intrusive_set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)8,true,true,true>>>
           *this,vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 *nonZeroRowIndices,Column_settings *colSettings)

{
  iiterator_members<boost::intrusive::rbtree_node<void_*>_*,_const_boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>::Matrix_column_tag,_3U>_*,_false>
  iVar1;
  pointer ppVar2;
  int iVar3;
  pair<unsigned_int,_unsigned_int> *p;
  pointer ppVar4;
  uint local_3c;
  iterator local_38;
  
  *(undefined4 *)this = 0xffffffff;
  *(undefined8 *)(this + 8) = 0;
  ppVar4 = (nonZeroRowIndices->
           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  ppVar2 = (nonZeroRowIndices->
           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  iVar3 = (int)((ulong)((long)ppVar4 - (long)ppVar2) >> 3) + -1;
  if (ppVar4 == ppVar2) {
    iVar3 = 0;
  }
  *(int *)(this + 0x10) = iVar3;
  iVar1.nodeptr_ = (rbtree_node<void_*> *)(this + 0x18);
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)(this + 0x20) = 0;
  *(undefined8 *)(this + 0x28) = 0;
  *(undefined8 *)(this + 0x30) = 0;
  *(rbtree_node<void_*> **)(this + 0x20) = iVar1.nodeptr_;
  *(rbtree_node<void_*> **)(this + 0x28) = iVar1.nodeptr_;
  *(undefined1 **)(this + 0x40) = &colSettings->field_0x20;
  *(Column_settings **)(this + 0x38) = colSettings;
  ppVar2 = (nonZeroRowIndices->
           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar4 = (nonZeroRowIndices->
                super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                )._M_impl.super__Vector_impl_data._M_start; ppVar4 != ppVar2; ppVar4 = ppVar4 + 1) {
    local_3c = ppVar4->second;
    if (**(uint **)(this + 0x38) <= local_3c) {
      local_3c = local_3c % **(uint **)(this + 0x38);
    }
    local_38.members_.nodeptr_ =
         (iiterator_members<boost::intrusive::rbtree_node<void_*>_*,_const_boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>::Matrix_column_tag,_3U>_*,_false>
          )(iiterator_members<boost::intrusive::rbtree_node<void_*>_*,_const_boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>::Matrix_column_tag,_3U>_*,_false>
            )iVar1.nodeptr_;
    Intrusive_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>_>
    ::_insert_entry((Intrusive_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>_>
                     *)this,&local_3c,ppVar4->first,&local_38);
  }
  return;
}

Assistant:

inline Intrusive_set_column<Master_matrix>::Intrusive_set_column(const Container& nonZeroRowIndices,
                                                                 Column_settings* colSettings)
    : RA_opt(),
      Dim_opt(nonZeroRowIndices.size() == 0 ? 0 : nonZeroRowIndices.size() - 1),
      Chain_opt(),
      operators_(nullptr),
      entryPool_(&(colSettings->entryConstructor))
{
  static_assert(!Master_matrix::isNonBasic || Master_matrix::Option_list::is_of_boundary_type,
                "Constructor not available for chain columns, please specify the dimension of the chain.");

  if constexpr (Master_matrix::Option_list::is_z2) {
    for (ID_index id : nonZeroRowIndices) {
      _insert_entry(id, column_.end());
    }
  } else {
    operators_ = &(colSettings->operators);
    for (const auto& p : nonZeroRowIndices) {
      _insert_entry(operators_->get_value(p.second), p.first, column_.end());
    }
  }
}